

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translation.cpp
# Opt level: O3

vector<Quad_*,_std::allocator<Quad_*>_> * __thiscall
Translation::transform(Translation *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads)

{
  pointer ppQVar1;
  Quad *quadToCopy;
  iterator __position;
  vector<Quad*,std::allocator<Quad*>> *this_00;
  Quad *this_01;
  pointer ppQVar2;
  Quad *local_40;
  Translation *local_38;
  
  local_38 = this;
  this_00 = (vector<Quad*,std::allocator<Quad*>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  ppQVar1 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppQVar2 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppQVar2 != ppQVar1; ppQVar2 = ppQVar2 + 1) {
    quadToCopy = *ppQVar2;
    this_01 = (Quad *)operator_new(0x20);
    Quad::Quad(this_01,quadToCopy,local_38->direction);
    __position._M_current = *(Quad ***)(this_00 + 8);
    local_40 = this_01;
    if (__position._M_current == *(Quad ***)(this_00 + 0x10)) {
      std::vector<Quad*,std::allocator<Quad*>>::_M_realloc_insert<Quad*>
                (this_00,__position,&local_40);
    }
    else {
      *__position._M_current = this_01;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  return (vector<Quad_*,_std::allocator<Quad_*>_> *)this_00;
}

Assistant:

vector<Quad*>* Translation::transform(vector<Quad*>* quads) {
    vector<Quad*>* transformedQuads = new vector<Quad*>();
    for (auto quad : *quads) {
        transformedQuads->push_back(new Quad(quad, direction));
    }
    return transformedQuads;
}